

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  const_iterator cVar3;
  impl_string_type *piVar4;
  size_type sVar5;
  size_type sVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  error_category *peVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  path *ppVar12;
  path *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *pos;
  format fVar13;
  ulong uVar15;
  time_t *lwt;
  const_iterator cVar16;
  path target;
  path pe;
  path work;
  file_status sls;
  file_status fs;
  path root;
  iterator __begin3;
  iterator __end3;
  path local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  path local_1a0;
  path local_180;
  error_code *local_160;
  uint local_154;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  path *local_148;
  path local_140;
  impl_string_type local_120;
  char *local_100;
  path local_f8;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  iterator local_b0;
  iterator local_70;
  _Alloc_hider _Var14;
  
  if ((p->_path)._M_string_length == 0) {
    peVar10 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar10;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  bVar7 = path::has_root_directory(p);
  if (bVar7) {
    local_140._path._M_dataplus._M_p = (pointer)&local_140._path.field_2;
    pcVar2 = (p->_path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar2,pcVar2 + (p->_path)._M_string_length);
  }
  else {
    absolute(&local_140,p,ec);
  }
  path::root_path((path *)(local_d8 + 8),&local_140);
  local_180._path._M_dataplus._M_p = (pointer)((long)&local_180 + 0x10);
  local_180._path._M_string_length = 0;
  local_180._path.field_2._M_local_buf[0] = '\0';
  lwt = (time_t *)0x0;
  detail::status_ex((path *)local_d8,(error_code *)&local_140,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (ec->_M_value == 0) {
    if (local_d8._0_4_ != 1) {
      paVar11 = &local_1e0._path.field_2;
      local_150 = &(__return_storage_ptr__->_path).field_2;
      local_160 = ec;
      local_148 = __return_storage_ptr__;
      do {
        local_180._path._M_string_length = 0;
        *local_180._path._M_dataplus._M_p = '\0';
        local_70._first._M_current = local_140._path._M_dataplus._M_p;
        local_1e0._path._M_dataplus._M_p =
             local_140._path._M_string_length + local_140._path._M_dataplus._M_p;
        local_1a0._path._M_dataplus._M_p = local_140._path._M_dataplus._M_p;
        path::iterator::iterator
                  (&local_b0,&local_70._first,(const_iterator *)&local_1e0,
                   (const_iterator *)&local_1a0);
        local_1e0._path._M_dataplus._M_p = local_140._path._M_dataplus._M_p;
        local_1c0._M_allocated_capacity =
             (size_type)(local_140._path._M_dataplus._M_p + local_140._path._M_string_length);
        pos = &local_1c0;
        local_1a0._path._M_dataplus._M_p = (pointer)local_1c0._M_allocated_capacity;
        path::iterator::iterator
                  (&local_70,(const_iterator *)&local_1e0,(const_iterator *)&local_1a0,
                   (const_iterator *)&pos->_M_allocated_capacity);
        local_154 = 0;
        while( true ) {
          cVar3._M_current = local_70._iter._M_current;
          cVar16._M_current = local_b0._iter._M_current;
          if (local_b0._iter._M_current == local_70._iter._M_current) break;
          local_100 = local_b0._iter._M_current;
          local_1a0._path._M_dataplus._M_p = (pointer)&local_1a0._path.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a0,local_b0._current._path._M_dataplus._M_p,
                     local_b0._current._path._M_dataplus._M_p +
                     local_b0._current._path._M_string_length);
          sVar5 = local_1a0._path._M_string_length;
          bVar7 = true;
          if (local_1a0._path._M_string_length != 0) {
            local_1e0._path._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,".","");
            local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
            _Var14._M_p = local_1e0._path._M_dataplus._M_p;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_120,local_1e0._path._M_dataplus._M_p,
                       (error_category *)
                       (local_1e0._path._M_string_length + (long)local_1e0._path._M_dataplus._M_p));
            fVar13 = (format)_Var14._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._path._M_dataplus._M_p != paVar11) {
              uVar15 = local_1e0._path.field_2._M_allocated_capacity + 1;
              operator_delete(local_1e0._path._M_dataplus._M_p,uVar15);
              fVar13 = (format)uVar15;
            }
            path::postprocess_path_with_format(&local_120,fVar13);
            if (local_1a0._path._M_string_length == local_120._M_string_length) {
              if (local_1a0._path._M_string_length != 0) {
                iVar8 = bcmp(local_1a0._path._M_dataplus._M_p,local_120._M_dataplus._M_p,
                             local_1a0._path._M_string_length);
                bVar7 = iVar8 == 0;
              }
            }
            else {
              bVar7 = false;
            }
          }
          if ((sVar5 != 0) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2)) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          iVar8 = 5;
          if (!bVar7) {
            local_1e0._path._M_dataplus._M_p = (pointer)paVar11;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"..","");
            local_1c0._M_allocated_capacity = (size_type)&local_1b0;
            _Var14._M_p = local_1e0._path._M_dataplus._M_p;
            std::__cxx11::string::
            _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((string *)&local_1c0,local_1e0._path._M_dataplus._M_p,
                       (error_category *)
                       (local_1e0._path._M_string_length + (long)local_1e0._path._M_dataplus._M_p));
            fVar13 = (format)_Var14._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._path._M_dataplus._M_p != paVar11) {
              uVar15 = local_1e0._path.field_2._M_allocated_capacity + 1;
              operator_delete(local_1e0._path._M_dataplus._M_p,uVar15);
              fVar13 = (format)uVar15;
            }
            path::postprocess_path_with_format((impl_string_type *)&local_1c0,fVar13);
            if (local_1a0._path._M_string_length == local_1c0._8_8_) {
              if (local_1a0._path._M_string_length == 0) {
                bVar7 = true;
              }
              else {
                iVar9 = bcmp(local_1a0._path._M_dataplus._M_p,
                             (void *)local_1c0._M_allocated_capacity,
                             local_1a0._path._M_string_length);
                bVar7 = iVar9 == 0;
              }
            }
            else {
              bVar7 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._M_allocated_capacity != &local_1b0) {
              operator_delete((void *)local_1c0._M_allocated_capacity,
                              local_1b0._M_allocated_capacity + 1);
            }
            if (bVar7) {
              path::parent_path(&local_1e0,&local_180);
              std::__cxx11::string::operator=((string *)&local_180,(string *)&local_1e0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._path._M_dataplus._M_p != paVar11) {
                operator_delete(local_1e0._path._M_dataplus._M_p,
                                local_1e0._path.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              operator/((path *)&local_1c0,&local_180,&local_1a0);
              local_1e0._path._M_dataplus._M_p = (pointer)paVar11;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e0,local_1c0._M_allocated_capacity,
                         local_1c0._8_8_ + local_1c0._M_allocated_capacity);
              sVar5 = local_1e0._path._M_string_length;
              paVar1 = &local_f8._path.field_2;
              local_f8._path._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f8,local_d8._8_8_,
                         (char *)(local_d8._8_8_ + local_c8._M_allocated_capacity));
              sVar6 = local_f8._path._M_string_length;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._path._M_dataplus._M_p != paVar1) {
                operator_delete(local_f8._path._M_dataplus._M_p,
                                local_f8._path.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._path._M_dataplus._M_p != paVar11) {
                operator_delete(local_1e0._path._M_dataplus._M_p,
                                local_1e0._path.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._M_allocated_capacity != &local_1b0) {
                operator_delete((void *)local_1c0._M_allocated_capacity,
                                local_1b0._M_allocated_capacity + 1);
              }
              if (sVar6 < sVar5) {
                operator/(&local_1e0,&local_180,&local_1a0);
                detail::symlink_status_ex
                          (&local_f8,(error_code *)&local_1e0,(uintmax_t *)local_160,
                           &pos->_M_allocated_capacity,lwt);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._path._M_dataplus._M_p != paVar11) {
                  operator_delete(local_1e0._path._M_dataplus._M_p,
                                  local_1e0._path.field_2._M_allocated_capacity + 1);
                }
                if (local_160->_M_value == 0) {
                  if ((int)local_f8._path._M_dataplus._M_p == 4) {
                    operator/((path *)&local_1c0,&local_180,&local_1a0);
                    read_symlink(&local_1e0,(path *)&local_1c0,local_160);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_allocated_capacity != &local_1b0) {
                      operator_delete((void *)local_1c0._M_allocated_capacity,
                                      local_1b0._M_allocated_capacity + 1);
                    }
                    if (local_160->_M_value == 0) {
                      bVar7 = path::has_root_directory(&local_1e0);
                      iVar8 = 5;
                      if (bVar7) {
                        ppVar12 = (path *)std::__cxx11::string::_M_assign((string *)&local_180);
                      }
                      else {
                        ppVar12 = path::operator/=(&local_180,&local_1e0);
                      }
                    }
                    else {
                      (local_148->_path)._M_dataplus._M_p = (pointer)local_150;
                      (local_148->_path)._M_string_length = 0;
                      (local_148->_path).field_2._M_local_buf[0] = '\0';
                      iVar8 = 1;
                      ppVar12 = local_148;
                      pos = local_150;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1e0._path._M_dataplus._M_p != paVar11) {
                      operator_delete(local_1e0._path._M_dataplus._M_p,
                                      local_1e0._path.field_2._M_allocated_capacity + 1);
                      ppVar12 = extraout_RAX;
                    }
                    local_154 = (uint)CONCAT71((int7)((ulong)ppVar12 >> 8),1);
                  }
                  else {
                    iVar8 = 0;
                    path::operator/=(&local_180,&local_1a0);
                  }
                }
                else {
                  (local_148->_path)._M_dataplus._M_p = (pointer)local_150;
                  (local_148->_path)._M_string_length = 0;
                  (local_148->_path).field_2._M_local_buf[0] = '\0';
                  iVar8 = 1;
                  pos = local_150;
                }
              }
              else {
                path::operator/=(&local_180,&local_1a0);
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._path._M_dataplus._M_p != &local_1a0._path.field_2) {
            operator_delete(local_1a0._path._M_dataplus._M_p,
                            local_1a0._path.field_2._M_allocated_capacity + 1);
          }
          if ((iVar8 != 5) && (cVar16._M_current = local_100, iVar8 != 0)) break;
          path::iterator::operator++(&local_b0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._current._path._M_dataplus._M_p != &local_70._current._path.field_2) {
          operator_delete(local_70._current._path._M_dataplus._M_p,
                          local_70._current._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._current._path._M_dataplus._M_p != &local_b0._current._path.field_2) {
          operator_delete(local_b0._current._path._M_dataplus._M_p,
                          local_b0._current._path.field_2._M_allocated_capacity + 1);
        }
        __return_storage_ptr__ = local_148;
        if (cVar16._M_current != cVar3._M_current) goto LAB_001568a0;
        std::__cxx11::string::_M_assign((string *)&local_140);
      } while ((local_154 & 1) != 0);
      peVar10 = (error_category *)std::_V2::system_category();
      local_160->_M_value = 0;
      local_160->_M_cat = peVar10;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)local_150;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&local_180 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._path._M_dataplus._M_p == paVar11) {
        cVar3._M_current._1_7_ = local_180._path.field_2._M_allocated_capacity._1_7_;
        cVar3._M_current._0_1_ = local_180._path.field_2._M_local_buf[0];
        local_150->_M_allocated_capacity = (size_type)cVar3._M_current;
        ((const_iterator *)((long)local_150 + 8))->_M_current =
             (char *)local_180._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_180._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_180._path.field_2._M_allocated_capacity._1_7_,
                      local_180._path.field_2._M_local_buf[0]);
      }
      piVar4 = &local_180._path;
      (__return_storage_ptr__->_path)._M_string_length = local_180._path._M_string_length;
      local_180._path._M_dataplus._M_p = (pointer)paVar11;
      goto LAB_00156896;
    }
    peVar10 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar10;
  }
  paVar11 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar11;
  piVar4 = &__return_storage_ptr__->_path;
LAB_00156896:
  piVar4->_M_string_length = 0;
  paVar11->_M_local_buf[0] = '\0';
LAB_001568a0:
  if (local_180._path._M_dataplus._M_p != (pointer)((long)&local_180 + 0x10)) {
    operator_delete(local_180._path._M_dataplus._M_p,
                    CONCAT71(local_180._path.field_2._M_allocated_capacity._1_7_,
                             local_180._path.field_2._M_local_buf[0]) + 1);
  }
  if ((char *)local_d8._8_8_ != local_c8._M_local_buf + 8) {
    operator_delete((void *)local_d8._8_8_,local_c8._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._path._M_dataplus._M_p != &local_140._path.field_2) {
    operator_delete(local_140._path._M_dataplus._M_p,
                    local_140._path.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path root = work.root_path();
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= root.string().length()) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}